

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeWithConstantOnLeft(OptimizeInstructions *this,Binary *curr)

{
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
  matcher;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_00;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  matcher_01;
  Type TVar1;
  bool bVar2;
  BinaryOp BVar3;
  BinaryOp BVar4;
  int64_t iVar5;
  Const **ppCVar6;
  Expression **binder;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *in_R8;
  byte local_63d;
  byte local_611;
  Literal local_610;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_5f8 [2];
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>
  local_5e8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
  local_588;
  undefined1 local_560 [8];
  Expression *right;
  Literal local_550;
  undefined1 local_538 [80];
  undefined1 local_4e8 [104];
  undefined1 local_480 [40];
  Literal local_458;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  local_440;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *local_400 [2];
  undefined1 local_3f0 [104];
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&>
  local_388;
  undefined1 local_360 [8];
  Expression *x;
  Const *c2;
  Const *c1;
  EffectAnalyzer local_340;
  Const *local_1d0;
  Const *local_1c8;
  Const *local_1c0;
  byte local_1a1;
  EffectAnalyzer local_1a0;
  Const *local_30;
  Const *left;
  Type type;
  Binary *curr_local;
  OptimizeInstructions *this_local;
  
  left = (Const *)(curr->left->type).id;
  type.id = (uintptr_t)curr;
  local_30 = Expression::cast<wasm::Const>(curr->left);
  bVar2 = Abstract::hasAnyShift(*(BinaryOp *)(type.id + 0x10));
  local_1a1 = 0;
  local_611 = 0;
  if (bVar2) {
    bVar2 = wasm::Literal::isZero(&local_30->value);
    local_611 = 0;
    if (bVar2) {
      effects(&local_1a0,this,*(Expression **)(type.id + 0x20));
      local_1a1 = 1;
      bVar2 = EffectAnalyzer::hasSideEffects(&local_1a0);
      local_611 = bVar2 ^ 0xff;
    }
  }
  if ((local_1a1 & 1) != 0) {
    EffectAnalyzer::~EffectAnalyzer(&local_1a0);
  }
  if ((local_611 & 1) != 0) {
    return *(Expression **)(type.id + 0x18);
  }
  BVar4 = *(BinaryOp *)(type.id + 0x10);
  local_1c0 = left;
  BVar3 = Abstract::getBinary((Type)left,ShrS);
  c1._7_1_ = 0;
  if (BVar4 != BVar3) {
    BVar4 = *(BinaryOp *)(type.id + 0x10);
    local_1c8 = left;
    BVar3 = Abstract::getBinary((Type)left,RotL);
    if (BVar4 != BVar3) {
      BVar4 = *(BinaryOp *)(type.id + 0x10);
      local_1d0 = left;
      BVar3 = Abstract::getBinary((Type)left,RotR);
      local_63d = 0;
      if (BVar4 != BVar3) goto LAB_018ec791;
    }
  }
  iVar5 = wasm::Literal::getInteger(&local_30->value);
  local_63d = 0;
  if (iVar5 == -1) {
    effects(&local_340,this,*(Expression **)(type.id + 0x20));
    c1._7_1_ = 1;
    bVar2 = EffectAnalyzer::hasSideEffects(&local_340);
    local_63d = bVar2 ^ 0xff;
  }
LAB_018ec791:
  if ((c1._7_1_ & 1) != 0) {
    EffectAnalyzer::~EffectAnalyzer(&local_340);
  }
  TVar1.id = type.id;
  if ((local_63d & 1) == 0) {
    ppCVar6 = &c2;
    Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                 *)(local_3f0 + 0x28),ppCVar6);
    local_400[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                              local_360,(Expression **)ppCVar6);
    Match::ival(&local_440,(Const **)&x);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>>
              ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)local_3f0,(Match *)0x3,(Op)local_400,
               (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_440,in_R8);
    Match::
    binary<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>>
              (&local_388,(Match *)0x4,(int)local_3f0 + 0x28,
               (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                *)local_3f0,
               (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)in_R8);
    matcher.data = local_388.data;
    matcher._12_4_ = local_388._12_4_;
    matcher.binder = local_388.binder;
    matcher.submatchers.curr = local_388.submatchers.curr;
    matcher.submatchers.next.curr = local_388.submatchers.next.curr;
    matcher.submatchers.next._8_8_ = local_388.submatchers.next._8_8_;
    bVar2 = Match::
            matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&>&>>
                      ((Expression *)TVar1.id,matcher);
    TVar1 = type;
    if (bVar2) {
      wasm::Literal::sub(&local_458,&c2->value,(Literal *)(x + 1));
      wasm::Literal::operator=(&local_30->value,&local_458);
      wasm::Literal::~Literal(&local_458);
      *(undefined1 (*) [8])(type.id + 0x20) = local_360;
      this_local = (OptimizeInstructions *)type.id;
    }
    else {
      Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                   *)(local_4e8 + 0x28),&c2);
      ppCVar6 = (Const **)&x;
      Match::ival((Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                   *)(local_538 + 0x10),ppCVar6);
      local_538._0_8_ =
           Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_360,
                      (Expression **)ppCVar6);
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                  *)local_4e8,(Match *)0x4,(int)local_538 + Or,
                 (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                  *)local_538,(Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)in_R8)
      ;
      binder = (Expression **)0x4;
      Match::
      binary<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                ((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>_&>
                  *)local_480,(Match *)0x4,(int)local_4e8 + 0x28,
                 (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                  *)local_4e8,
                 (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                  *)in_R8);
      matcher_00._8_8_ = local_480._8_8_;
      matcher_00.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
            *)local_480._0_8_;
      matcher_00.submatchers.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
            *)local_480._16_8_;
      matcher_00.submatchers.next.curr =
           (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
            *)local_480._24_8_;
      matcher_00.submatchers.next._8_8_ = local_480._32_8_;
      bVar2 = Match::
              matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                        ((Expression *)TVar1.id,matcher_00);
      TVar1 = type;
      if (bVar2) {
        wasm::Literal::sub(&local_550,&c2->value,(Literal *)(x + 1));
        wasm::Literal::operator=(&local_30->value,&local_550);
        wasm::Literal::~Literal(&local_550);
        right = (Expression *)left;
        BVar4 = Abstract::getBinary((Type)left,Add);
        *(BinaryOp *)(type.id + 0x10) = BVar4;
        *(undefined1 (*) [8])(type.id + 0x20) = local_360;
        std::swap<wasm::Expression*>
                  ((Expression **)(type.id + 0x18),(Expression **)(type.id + 0x20));
        this_local = (OptimizeInstructions *)type.id;
      }
      else {
        Match::fval();
        local_5f8[0] = Match::any((Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)
                                  local_560,binder);
        Match::
        unary<wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>>
                  ((Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                    *)&local_5e8,(Match *)0x1,(Op)local_5f8,
                   (Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)local_480._32_8_)
        ;
        Match::
        binary<wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>>
                  (&local_588,(Match *)0x7,(int)&local_5e8 + 0x20,&local_5e8,
                   (Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&>
                    *)in_R8);
        matcher_01.data = local_588.data;
        matcher_01._12_4_ = local_588._12_4_;
        matcher_01.binder = local_588.binder;
        matcher_01.submatchers.curr = local_588.submatchers.curr;
        matcher_01.submatchers.next.curr = local_588.submatchers.next.curr;
        matcher_01.submatchers.next._8_8_ = local_588.submatchers.next._8_8_;
        bVar2 = Match::
                matches<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,wasm::Match::Internal::Matcher<wasm::Const*,wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<double>>>>&,wasm::Match::Internal::Matcher<wasm::Match::Internal::UnaryOpKind<wasm::Match::Internal::AbstractUnaryOpK>,wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression*>>&>&>>
                          ((Expression *)TVar1.id,matcher_01);
        if (bVar2) {
          wasm::Literal::neg(&local_610,&local_30->value);
          wasm::Literal::operator=(&local_30->value,&local_610);
          wasm::Literal::~Literal(&local_610);
          *(undefined1 (*) [8])(type.id + 0x20) = local_560;
          this_local = (OptimizeInstructions *)type.id;
        }
        else {
          this_local = (OptimizeInstructions *)0x0;
        }
      }
    }
  }
  else {
    this_local = *(OptimizeInstructions **)(type.id + 0x18);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* optimizeWithConstantOnLeft(Binary* curr) {
    using namespace Match;
    using namespace Abstract;

    auto type = curr->left->type;
    auto* left = curr->left->cast<Const>();
    // 0 <<>> x   ==>   0
    if (Abstract::hasAnyShift(curr->op) && left->value.isZero() &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    // (signed)-1 >> x   ==>   -1
    // rotl(-1, x)       ==>   -1
    // rotr(-1, x)       ==>   -1
    if ((curr->op == Abstract::getBinary(type, ShrS) ||
         curr->op == Abstract::getBinary(type, RotL) ||
         curr->op == Abstract::getBinary(type, RotR)) &&
        left->value.getInteger() == -1LL &&
        !effects(curr->right).hasSideEffects()) {
      return curr->left;
    }
    {
      // C1 - (x + C2)  ==>  (C1 - C2) - x
      Const *c1, *c2;
      Expression* x;
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Add, any(&x), ival(&c2))))) {
        left->value = c1->value.sub(c2->value);
        curr->right = x;
        return curr;
      }
      // C1 - (C2 - x)  ==>   x + (C1 - C2)
      if (matches(curr,
                  binary(Sub, ival(&c1), binary(Sub, ival(&c2), any(&x))))) {
        left->value = c1->value.sub(c2->value);
        curr->op = Abstract::getBinary(type, Add);
        curr->right = x;
        std::swap(curr->left, curr->right);
        return curr;
      }
    }
    {
      // fval(C) / -x   ==>  -C / x
      Expression* right;
      if (matches(curr, binary(DivS, fval(), unary(Neg, any(&right))))) {
        left->value = left->value.neg();
        curr->right = right;
        return curr;
      }
    }
    return nullptr;
  }